

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void run_wnaf(void)

{
  int iVar1;
  secp256k1_scalar n;
  int i;
  int in_stack_0000045c;
  secp256k1_scalar *in_stack_00000460;
  int in_stack_0000048c;
  secp256k1_scalar *in_stack_00000490;
  uint in_stack_ffffffffffffffdc;
  secp256k1_scalar *in_stack_ffffffffffffffe0;
  int iVar2;
  
  test_fixed_wnaf_small();
  for (iVar2 = 0; iVar2 < COUNT; iVar2 = iVar2 + 1) {
    testutil_random_scalar_order((secp256k1_scalar *)n.d[0]);
    test_wnaf(in_stack_00000460,in_stack_0000045c);
    test_fixed_wnaf(in_stack_00000490,in_stack_0000048c);
  }
  secp256k1_scalar_set_int(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  iVar1 = secp256k1_scalar_cond_negate((secp256k1_scalar *)n.d[0],iVar2);
  if (iVar1 != -1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x14ec,"test condition failed: secp256k1_scalar_cond_negate(&n, 1) == -1");
    abort();
  }
  iVar1 = secp256k1_scalar_is_zero((secp256k1_scalar *)0x11450e);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x14ed,"test condition failed: secp256k1_scalar_is_zero(&n)");
    abort();
  }
  iVar2 = secp256k1_scalar_cond_negate((secp256k1_scalar *)n.d[0],iVar2);
  if (iVar2 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x14ee,"test condition failed: secp256k1_scalar_cond_negate(&n, 0) == 1");
    abort();
  }
  iVar2 = secp256k1_scalar_is_zero((secp256k1_scalar *)0x1145b6);
  if (iVar2 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x14ef,"test condition failed: secp256k1_scalar_is_zero(&n)");
    abort();
  }
  return;
}

Assistant:

static void run_wnaf(void) {
    int i;
    secp256k1_scalar n;

    /* Test 0 for fixed wnaf */
    test_fixed_wnaf_small();
    /* Random tests */
    for (i = 0; i < COUNT; i++) {
        testutil_random_scalar_order(&n);
        test_wnaf(&n, 4+(i%10));
        test_fixed_wnaf(&n, 4 + (i % 10));
    }
    secp256k1_scalar_set_int(&n, 0);
    CHECK(secp256k1_scalar_cond_negate(&n, 1) == -1);
    CHECK(secp256k1_scalar_is_zero(&n));
    CHECK(secp256k1_scalar_cond_negate(&n, 0) == 1);
    CHECK(secp256k1_scalar_is_zero(&n));
}